

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::Parser::SkipRestOfBlock(Parser *this)

{
  bool bVar1;
  Parser *in_RDI;
  Tokenizer *in_stack_000000b8;
  char *in_stack_000000c0;
  Parser *in_stack_000000c8;
  TokenType in_stack_ffffffffffffffec;
  Parser *this_00;
  
  this_00 = in_RDI;
  do {
    bVar1 = AtEnd((Parser *)0x607ecd);
    if (bVar1) {
      return;
    }
    bVar1 = LookingAtType(in_RDI,in_stack_ffffffffffffffec);
    if (bVar1) {
      bVar1 = TryConsumeEndOfDeclaration
                        (in_stack_000000c8,in_stack_000000c0,(LocationRecorder *)in_stack_000000b8);
      if (bVar1) {
        return;
      }
      bVar1 = TryConsume(this_00,(char *)in_RDI);
      if (bVar1) {
        SkipRestOfBlock(in_RDI);
      }
    }
    io::Tokenizer::Next(in_stack_000000b8);
  } while( true );
}

Assistant:

void Parser::SkipRestOfBlock() {
  while (true) {
    if (AtEnd()) {
      return;
    } else if (LookingAtType(io::Tokenizer::TYPE_SYMBOL)) {
      if (TryConsumeEndOfDeclaration("}", NULL)) {
        return;
      } else if (TryConsume("{")) {
        SkipRestOfBlock();
      }
    }
    input_->Next();
  }
}